

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sspm.cpp
# Opt level: O3

void __thiscall pg::SSPMSolver::prog_tmp(SSPMSolver *this,int pindex,int h)

{
  int iVar1;
  int iVar2;
  uint64_t *puVar3;
  byte bVar4;
  int *piVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong *puVar12;
  ulong uVar13;
  ulong uVar14;
  
  piVar5 = this->tmp_d;
  iVar1 = *piVar5;
  if (iVar1 != -1) {
    iVar7 = this->l;
    uVar11 = (ulong)iVar7;
    if (pindex < piVar5[uVar11 - 1]) {
      puVar3 = (this->tmp_b)._bits;
      if (0 < iVar7) {
        do {
          iVar1 = (int)uVar11;
          uVar6 = iVar1 - 1;
          if (piVar5[uVar6] <= pindex) goto LAB_0016dfa7;
          bVar4 = (byte)uVar6 & 0x3f;
          puVar12 = puVar3 + (uVar6 >> 6);
          *puVar12 = *puVar12 & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
          uVar11 = (ulong)(iVar1 - 1U);
          piVar5[uVar6] = pindex;
        } while (iVar1 - 1U != 0 && 0 < iVar1);
        uVar6 = 0xffffffff;
LAB_0016dfa7:
        iVar7 = uVar6 + 1;
      }
      puVar12 = puVar3 + ((ulong)(long)iVar7 >> 6);
      *puVar12 = *puVar12 | 1L << ((long)iVar7 & 0x3fU);
    }
    else if (0 < iVar7) {
      puVar3 = (this->tmp_b)._bits;
      uVar11 = uVar11 - 1;
      uVar13 = 1L << (uVar11 & 0x3f);
      uVar10 = uVar11 & 0xffffffff;
      puVar12 = puVar3 + (uVar11 >> 6 & 0x3ffffff);
      uVar9 = *puVar12;
      if ((uVar9 >> (uVar11 & 0x3f) & 1) == 0) {
        uVar6 = (uint)uVar11;
      }
      else {
        uVar14 = uVar11 & 0xffffffff;
        do {
          uVar6 = (int)uVar14 - 1;
          uVar10 = (ulong)uVar6;
          if ((int)uVar14 == 0) {
            if (iVar1 != 0) {
              *(byte *)puVar3 = (byte)*puVar3 | 1;
              lVar8 = 0;
              do {
                piVar5[lVar8] = iVar1 + -1;
                lVar8 = lVar8 + 1;
              } while (lVar8 < this->l);
              return;
            }
            *(byte *)puVar3 = (byte)*puVar3 & 0xfe;
            *piVar5 = -1;
            return;
          }
          iVar2 = piVar5[uVar14];
          if (piVar5[uVar14 - 1] != iVar2) {
            *puVar12 = uVar9 | uVar13;
            if (iVar7 <= (int)uVar11) {
              return;
            }
            piVar5 = piVar5 + (uVar11 & 0xffffffff);
            do {
              *piVar5 = iVar2 + -1;
              piVar5 = piVar5 + 1;
              uVar6 = (int)uVar11 + 1;
              uVar11 = (ulong)uVar6;
            } while ((int)uVar6 < this->l);
            return;
          }
          uVar11 = ~uVar13;
          uVar13 = 1L << (uVar10 & 0x3f);
          *puVar12 = uVar11 & uVar9;
          puVar12 = puVar3 + (uVar6 >> 6);
          uVar9 = *puVar12;
          uVar11 = uVar10;
          uVar14 = uVar10;
        } while ((uVar9 >> (uVar10 & 0x3f) & 1) != 0);
      }
      iVar1 = piVar5[uVar10];
      if (iVar1 == h) {
        *puVar12 = uVar9 | uVar13;
      }
      else {
        *puVar12 = ~uVar13 & uVar9;
        if ((int)uVar6 < iVar7) {
          piVar5 = piVar5 + uVar10;
          do {
            *piVar5 = iVar1 + 1;
            piVar5 = piVar5 + 1;
            uVar6 = (int)uVar10 + 1;
            uVar10 = (ulong)uVar6;
          } while ((int)uVar6 < this->l);
        }
      }
    }
  }
  return;
}

Assistant:

void
SSPMSolver::prog_tmp(int pindex, int h)
{
    // Simple case 1: Top >_p Top
    if (tmp_d[0] == -1) return; // already Top

    // Simple case 2: Some bits below [pindex], ergo [pindex] can go from ..e to ..10*
    if (tmp_d[l-1] > pindex) {
        int i;
        for (i=l-1; i>=0 and tmp_d[i] > pindex; i--) {
            tmp_b[i] = 0;
            tmp_d[i] = pindex;
        }
        tmp_b[i+1] = 1;
        return;
    }

    // Case 3: no bits below [pindex], so analyze lowest nonempty level
    // * If lowest contains 0: 3a or 3b
    // * Else if lowest level is root: 3c
    // * Else append 100000000... to next higher level (3d, 3e, 3f)
    //
    // 3a: ,..011*  => ,..100*  (if lowest nonempty is the bottom)
    // 3b: ,..011*, => ,..,000* (if lowest nonempty is not the bottom)
    // 3c: 1111111  => Top      (if root contains only 1s)
    // 3d: ,1111111 => 100*     (if non-root contains only 1s)
    // 3e: ..,111*  => ..100*
    // 3f: ,e,111*  => ,100*

    // no bits below pindex, so just find smallest increase
    for (int i=l-1; i>=0; i--) {
        if (tmp_b[i] == 0) {
            if (tmp_d[i] == h) {
                // 3a: we found a 0 on the bottom, increase to 100...
                // ..011 => 00100
                tmp_b[i] = 1;
                break;
            } else {
                // 3b: we found a 0 (not bottom), increase to [eps] and 0s on leaf
                // ..011 => ..,000
                tmp_b[i] = 0;
                int new_d = tmp_d[i]+1;
                for (int k=i; k<l; k++) tmp_d[k] = new_d;
                break;
            }
        } else if (i == 0) {
            // we have only seen 1s and only 1 element
            if (tmp_d[0] == 0) {
                // 3c: we are already the highest, so go to top
                tmp_b[0] = 0;
                tmp_d[0] = -1;
                break;
            } else {
                // 3d: increase 1 higher...
                // ,e,111   => ,100
                int new_d = tmp_d[0]-1;
                tmp_b[0] = 1;
                for (int k=0; k<l; k++) tmp_d[k] = new_d;
                break;
            }
        } else if (tmp_d[i-1] != tmp_d[i]) {
            // 3e, 3f: next is different
            // two cases
            //  .,111   => .100
            // ,e,111   => ,100
            int new_d = tmp_d[i]-1;
            tmp_b[i] = 1;
            for (int k=i; k<l; k++) tmp_d[k] = new_d;
            break;
        } else {
            // next is same
            tmp_b[i] = 0;
        }
    }
}